

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

size_t CB::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  size_t sVar1;
  size_t sVar2;
  char *c;
  char *local_20;
  
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)v);
  sVar2 = 8;
  sVar1 = io_buf::buf_read(cache,&local_20,8);
  if (sVar1 < 8) {
    sVar2 = 0;
  }
  else {
    bufread_label((label *)v,local_20,cache);
  }
  return sVar2;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  CB::label* ld = (CB::label*)v;
  ld->costs.clear();
  char* c;
  size_t total = sizeof(size_t);
  if (cache.buf_read(c, total) < total)
    return 0;
  bufread_label(ld, c, cache);

  return total;
}